

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::clara::detail::Args::Args(Args *this,int argc,char **argv)

{
  undefined8 *in_RDX;
  string *in_RDI;
  char **__last;
  allocator *__first;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd0;
  allocator local_19 [25];
  
  __last = (char **)*in_RDX;
  __first = local_19;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(in_RDI,(char *)__last,__first);
  ::std::allocator<char>::~allocator((allocator<char> *)local_19);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x157d89);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<char_const*const*,void>
            (in_stack_ffffffffffffffd0,(char **)__first,__last,(allocator_type *)in_RDI);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x157dae);
  return;
}

Assistant:

Args( int argc, char const* const* argv )
            : m_exeName(argv[0]),
              m_args(argv + 1, argv + argc) {}